

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O3

ssize_t __thiscall
MarkerIndex::splice(MarkerIndex *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,
                   size_t __len,uint __flags)

{
  unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
  *puVar1;
  flat_set<unsigned_int> *pfVar2;
  uint value;
  undefined8 uVar3;
  param_type pVar4;
  bool bVar5;
  result_type_conflict rVar6;
  Node *node;
  Node *pNVar7;
  size_t sVar8;
  mapped_type *ppNVar9;
  Point PVar10;
  undefined4 in_register_0000000c;
  uint *puVar11;
  uint *puVar12;
  MarkerIndex *pMVar13;
  undefined4 in_register_00000034;
  uint *puVar14;
  MarkerIndex *this_00;
  param_type pVar15;
  flat_set<unsigned_int> *pfVar16;
  MarkerId id;
  MarkerIdSet starting_inside_splice;
  MarkerIdSet ending_inside_splice;
  uint local_ac;
  Node *local_a8;
  MarkerIndex *local_a0;
  flat_set<unsigned_int> *local_98;
  MarkerIndex *local_90;
  undefined1 local_88 [48];
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  Node *local_48;
  Point local_38;
  
  pMVar13 = (MarkerIndex *)CONCAT44(in_register_00000034,__fdin);
  local_88._32_8_ = CONCAT44(in_register_0000000c,__fdout);
  local_88._40_8_ = __offin;
  local_38 = (Point)__offout;
  std::
  _Hashtable<const_MarkerIndex::Node_*,_std::pair<const_MarkerIndex::Node_*const,_Point>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>,_std::__detail::_Select1st,_std::equal_to<const_MarkerIndex::Node_*>,_std::hash<const_MarkerIndex::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(pMVar13->node_position_cache)._M_h);
  (this->end_nodes_by_id)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->end_nodes_by_id)._M_h._M_bucket_count = 0;
  (this->start_nodes_by_id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->start_nodes_by_id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->start_nodes_by_id)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->start_nodes_by_id)._M_h._M_rehash_policy = 0;
  (this->start_nodes_by_id)._M_h._M_bucket_count = 0;
  (this->start_nodes_by_id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this->root = (Node *)0x0;
  (this->start_nodes_by_id)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->random_engine)._M_x = 0;
  (this->random_distribution)._M_param = (param_type)0x0;
  if ((pMVar13->root != (Node *)0x0) &&
     ((bVar5 = Point::is_zero((Point *)(local_88 + 0x20)), !bVar5 ||
      (bVar5 = Point::is_zero(&stack0xffffffffffffffc8), !bVar5)))) {
    local_90 = this;
    bVar5 = Point::is_zero((Point *)(local_88 + 0x20));
    node = Iterator::insert_splice_boundary(&pMVar13->iterator,(Point *)(local_88 + 0x28),false);
    local_88._0_8_ = Point::traverse((Point *)(local_88 + 0x28),(Point *)(local_88 + 0x20));
    pNVar7 = Iterator::insert_splice_boundary(&pMVar13->iterator,(Point *)local_88,bVar5);
    node->priority = -1;
    bubble_node_up(pMVar13,node);
    pNVar7->priority = -2;
    this_00 = pMVar13;
    bubble_node_up(pMVar13,pNVar7);
    local_88._0_4_ = 0;
    local_88._4_4_ = 0;
    local_88._8_4_ = 0;
    local_88._12_4_ = 0;
    local_88._16_8_ = (Node *)0x0;
    local_48 = (Node *)0x0;
    local_58 = 0;
    iStack_54 = 0;
    iStack_50 = 0;
    iStack_4c = 0;
    local_a8 = pNVar7;
    local_a0 = pMVar13;
    if (bVar5) {
      puVar12 = (node->start_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (puVar12 !=
          (node->start_marker_ids).contents.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_98 = &node->right_marker_ids;
        do {
          local_ac = *puVar12;
          this_00 = (MarkerIndex *)&pMVar13->exclusive_marker_ids;
          sVar8 = flat_set<unsigned_int>::count(&pMVar13->exclusive_marker_ids,local_ac);
          if (sVar8 == 0) {
            puVar12 = puVar12 + 1;
          }
          else {
            puVar14 = puVar12 + 1;
            puVar11 = (node->start_marker_ids).contents.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (puVar14 != puVar11) {
              memmove(puVar12,puVar14,(long)puVar11 - (long)puVar14);
              puVar11 = (node->start_marker_ids).contents.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            (node->start_marker_ids).contents.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar11 + -1;
            flat_set<unsigned_int>::erase(local_98,local_ac);
            flat_set<unsigned_int>::insert(&pNVar7->start_marker_ids,local_ac);
            this_00 = (MarkerIndex *)&pMVar13->start_nodes_by_id;
            ppNVar9 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&pMVar13->start_nodes_by_id,&local_ac);
            *ppNVar9 = local_a8;
          }
        } while (puVar12 !=
                 (node->start_marker_ids).contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      puVar12 = (node->end_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (puVar12 !=
          (node->end_marker_ids).contents.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pfVar2 = &local_a0->exclusive_marker_ids;
        pfVar16 = &local_a8->start_marker_ids;
        local_88._24_8_ = &node->right_marker_ids;
        local_98 = &local_a8->end_marker_ids;
        puVar1 = &local_a0->end_nodes_by_id;
        do {
          local_ac = *puVar12;
          sVar8 = flat_set<unsigned_int>::count(pfVar2,local_ac);
          if ((sVar8 == 0) ||
             (this_00 = (MarkerIndex *)pfVar16,
             sVar8 = flat_set<unsigned_int>::count(pfVar16,local_ac), sVar8 != 0)) {
            puVar14 = puVar12 + 1;
            puVar11 = (node->end_marker_ids).contents.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (puVar14 != puVar11) {
              memmove(puVar12,puVar14,(long)puVar11 - (long)puVar14);
              puVar11 = (node->end_marker_ids).contents.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            (node->end_marker_ids).contents.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar11 + -1;
            sVar8 = flat_set<unsigned_int>::count(pfVar16,local_ac);
            if (sVar8 == 0) {
              flat_set<unsigned_int>::insert((flat_set<unsigned_int> *)local_88._24_8_,local_ac);
            }
            flat_set<unsigned_int>::insert(local_98,local_ac);
            this_00 = (MarkerIndex *)puVar1;
            ppNVar9 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)puVar1,&local_ac);
            *ppNVar9 = local_a8;
          }
          else {
            puVar12 = puVar12 + 1;
          }
        } while (puVar12 !=
                 (node->end_marker_ids).contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    else {
      get_starting_and_ending_markers_within_subtree
                (pMVar13,node->right,(MarkerIdSet *)local_88,(MarkerIdSet *)&stack0xffffffffffffffa8
                );
      pVar4 = _iStack_50;
      this_00 = pMVar13;
      if (_local_58 != _iStack_50) {
        pfVar16 = &local_a8->end_marker_ids;
        local_98 = &node->right_marker_ids;
        puVar1 = &local_a0->end_nodes_by_id;
        pVar15 = _local_58;
        do {
          local_ac = *(uint *)pVar15;
          flat_set<unsigned_int>::insert(pfVar16,local_ac);
          sVar8 = flat_set<unsigned_int>::count((flat_set<unsigned_int> *)local_88,local_ac);
          if (sVar8 == 0) {
            flat_set<unsigned_int>::insert(local_98,local_ac);
          }
          this_00 = (MarkerIndex *)puVar1;
          ppNVar9 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)puVar1,&local_ac);
          *ppNVar9 = local_a8;
          pVar15 = (param_type)((long)pVar15 + 4);
        } while (pVar15 != pVar4);
      }
      puVar12 = (local_a8->end_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar11 = (local_a8->end_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (puVar12 != puVar11) {
        pfVar2 = &local_a0->exclusive_marker_ids;
        pfVar16 = &local_a8->start_marker_ids;
        do {
          value = *puVar12;
          this_00 = (MarkerIndex *)pfVar2;
          sVar8 = flat_set<unsigned_int>::count(pfVar2,value);
          if ((sVar8 != 0) &&
             (this_00 = (MarkerIndex *)pfVar16, sVar8 = flat_set<unsigned_int>::count(pfVar16,value)
             , sVar8 == 0)) {
            this_00 = (MarkerIndex *)&stack0xffffffffffffffa8;
            flat_set<unsigned_int>::insert((flat_set<unsigned_int> *)this_00,value);
          }
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar11);
      }
      uVar3 = local_88._8_8_;
      if (local_88._0_8_ != local_88._8_8_) {
        pfVar16 = &local_a8->start_marker_ids;
        puVar1 = &local_a0->start_nodes_by_id;
        PVar10 = (Point)local_88._0_8_;
        do {
          local_ac = *(uint *)PVar10;
          flat_set<unsigned_int>::insert(pfVar16,local_ac);
          this_00 = (MarkerIndex *)puVar1;
          ppNVar9 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)puVar1,&local_ac);
          *ppNVar9 = local_a8;
          PVar10 = (Point)((long)PVar10 + 4);
        } while (PVar10 != (Point)uVar3);
      }
      this = local_90;
      puVar12 = (node->start_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (puVar12 !=
          (node->start_marker_ids).contents.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pfVar16 = &local_a0->exclusive_marker_ids;
        local_98 = &node->right_marker_ids;
        local_88._24_8_ = &local_a8->start_marker_ids;
        puVar1 = &local_a0->start_nodes_by_id;
        do {
          local_ac = *puVar12;
          this_00 = (MarkerIndex *)pfVar16;
          sVar8 = flat_set<unsigned_int>::count(pfVar16,local_ac);
          if ((sVar8 == 0) ||
             (this_00 = (MarkerIndex *)&node->end_marker_ids,
             sVar8 = flat_set<unsigned_int>::count(&node->end_marker_ids,local_ac), sVar8 != 0)) {
            puVar12 = puVar12 + 1;
          }
          else {
            puVar14 = puVar12 + 1;
            puVar11 = (node->start_marker_ids).contents.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (puVar14 != puVar11) {
              memmove(puVar12,puVar14,(long)puVar11 - (long)puVar14);
              puVar11 = (node->start_marker_ids).contents.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            (node->start_marker_ids).contents.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar11 + -1;
            flat_set<unsigned_int>::erase(local_98,local_ac);
            flat_set<unsigned_int>::insert((flat_set<unsigned_int> *)local_88._24_8_,local_ac);
            ppNVar9 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)puVar1,&local_ac);
            *ppNVar9 = local_a8;
            this_00 = (MarkerIndex *)local_88;
            flat_set<unsigned_int>::insert((flat_set<unsigned_int> *)this_00,local_ac);
          }
        } while (puVar12 !=
                 (node->start_marker_ids).contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    pNVar7 = local_a8;
    populate_splice_invalidation_sets
              (this_00,(SpliceResult *)this,node,local_a8,(MarkerIdSet *)local_88,
               (MarkerIdSet *)&stack0xffffffffffffffa8);
    pMVar13 = local_a0;
    if (node->right != (Node *)0x0) {
      delete_subtree(local_a0,node->right);
      node->right = (Node *)0x0;
    }
    PVar10 = Point::traverse((Point *)(local_88 + 0x28),&stack0xffffffffffffffc8);
    pNVar7->left_extent = PVar10;
    bVar5 = Point::operator==(&node->left_extent,&pNVar7->left_extent);
    if (bVar5) {
      puVar12 = (pNVar7->start_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar11 = (pNVar7->start_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (puVar12 != puVar11) {
        puVar1 = &local_a0->start_nodes_by_id;
        do {
          local_ac = *puVar12;
          flat_set<unsigned_int>::insert(&node->start_marker_ids,local_ac);
          flat_set<unsigned_int>::insert(&node->right_marker_ids,local_ac);
          ppNVar9 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)puVar1,&local_ac);
          *ppNVar9 = node;
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar11);
      }
      puVar12 = (local_a8->end_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar11 = (local_a8->end_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (puVar12 != puVar11) {
        pfVar16 = &local_a8->left_marker_ids;
        local_98 = &node->left_marker_ids;
        puVar1 = &local_a0->end_nodes_by_id;
        do {
          local_ac = *puVar12;
          flat_set<unsigned_int>::insert(&node->end_marker_ids,local_ac);
          sVar8 = flat_set<unsigned_int>::count(pfVar16,local_ac);
          if (sVar8 != 0) {
            flat_set<unsigned_int>::insert(local_98,local_ac);
            flat_set<unsigned_int>::erase(pfVar16,local_ac);
          }
          ppNVar9 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)puVar1,&local_ac);
          *ppNVar9 = node;
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar11);
      }
      this = local_90;
      pMVar13 = local_a0;
      delete_node(local_a0,local_a8);
    }
    else if (((long)(pNVar7->end_marker_ids).contents.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pNVar7->end_marker_ids).contents.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) +
             ((long)(pNVar7->start_marker_ids).contents.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pNVar7->start_marker_ids).contents.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) == 0) {
      delete_node(pMVar13,pNVar7);
    }
    else {
      rVar6 = std::uniform_int_distribution<int>::operator()
                        (&pMVar13->random_distribution,&pMVar13->random_engine,
                         &(pMVar13->random_distribution)._M_param);
      pNVar7->priority = rVar6;
      bubble_node_down(pMVar13,pNVar7);
    }
    if (((long)(node->end_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(node->end_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) +
        ((long)(node->start_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(node->start_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) == 0) {
      delete_node(pMVar13,node);
    }
    else {
      rVar6 = std::uniform_int_distribution<int>::operator()
                        (&pMVar13->random_distribution,&pMVar13->random_engine,
                         &(pMVar13->random_distribution)._M_param);
      node->priority = rVar6;
      bubble_node_down(pMVar13,node);
    }
    if (_local_58 != (param_type)0x0) {
      operator_delete((void *)_local_58,(long)local_48 - (long)_local_58);
    }
    if ((Point)local_88._0_8_ != (Point)0x0) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
    }
  }
  return (ssize_t)this;
}

Assistant:

MarkerIndex::SpliceResult MarkerIndex::splice(Point start, Point old_extent, Point new_extent) {
  node_position_cache.clear();

  SpliceResult invalidated;

  if (!root || (old_extent.is_zero() && new_extent.is_zero())) return invalidated;

  bool is_insertion = old_extent.is_zero();
  Node *start_node = iterator.insert_splice_boundary(start, false);
  Node *end_node = iterator.insert_splice_boundary(start.traverse(old_extent), is_insertion);

  start_node->priority = -1;
  bubble_node_up(start_node);
  end_node->priority = -2;
  bubble_node_up(end_node);

  MarkerIdSet starting_inside_splice;
  MarkerIdSet ending_inside_splice;

  if (is_insertion) {
    for (auto iter = start_node->start_marker_ids.begin(); iter != start_node->start_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) > 0) {
        iter = start_node->start_marker_ids.erase(iter);
        start_node->right_marker_ids.erase(id);
        end_node->start_marker_ids.insert(id);
        start_nodes_by_id[id] = end_node;
      } else {
        ++iter;
      }
    }
    for (auto iter = start_node->end_marker_ids.begin(); iter != start_node->end_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) == 0 || end_node->start_marker_ids.count(id) > 0) {
        iter = start_node->end_marker_ids.erase(iter);
        if (end_node->start_marker_ids.count(id) == 0) {
          start_node->right_marker_ids.insert(id);
        }
        end_node->end_marker_ids.insert(id);
        end_nodes_by_id[id] = end_node;
      } else {
        ++iter;
      }
    }
  } else {
    get_starting_and_ending_markers_within_subtree(start_node->right, &starting_inside_splice, &ending_inside_splice);

    for (MarkerId id : ending_inside_splice) {
      end_node->end_marker_ids.insert(id);
      if (!starting_inside_splice.count(id)) {
        start_node->right_marker_ids.insert(id);
      }
      end_nodes_by_id[id] = end_node;
    }

    for (MarkerId id : end_node->end_marker_ids) {
      if (exclusive_marker_ids.count(id) && !end_node->start_marker_ids.count(id)) {
        ending_inside_splice.insert(id);
      }
    }

    for (MarkerId id : starting_inside_splice) {
      end_node->start_marker_ids.insert(id);
      start_nodes_by_id[id] = end_node;
    }

    for (auto iter = start_node->start_marker_ids.begin(); iter != start_node->start_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) && !start_node->end_marker_ids.count(id)) {
        iter = start_node->start_marker_ids.erase(iter);
        start_node->right_marker_ids.erase(id);
        end_node->start_marker_ids.insert(id);
        start_nodes_by_id[id] = end_node;
        starting_inside_splice.insert(id);
      } else {
        ++iter;
      }
    }
  }

  populate_splice_invalidation_sets(&invalidated, start_node, end_node, starting_inside_splice, ending_inside_splice);

  if (start_node->right) {
    delete_subtree(start_node->right);
    start_node->right = nullptr;
  }

  end_node->left_extent = start.traverse(new_extent);

  if (start_node->left_extent == end_node->left_extent) {
    for (MarkerId id : end_node->start_marker_ids) {
      start_node->start_marker_ids.insert(id);
      start_node->right_marker_ids.insert(id);
      start_nodes_by_id[id] = start_node;
    }

    for (MarkerId id : end_node->end_marker_ids) {
      start_node->end_marker_ids.insert(id);
      if (end_node->left_marker_ids.count(id) > 0) {
        start_node->left_marker_ids.insert(id);
        end_node->left_marker_ids.erase(id);
      }
      end_nodes_by_id[id] = start_node;
    }
    delete_node(end_node);
  } else if (end_node->is_marker_endpoint()) {
    end_node->priority = generate_random_number();
    bubble_node_down(end_node);
  } else {
    delete_node(end_node);
  }

  if (start_node->is_marker_endpoint()) {
    start_node->priority = generate_random_number();
    bubble_node_down(start_node);
  } else {
    delete_node(start_node);
  }

  return invalidated;
}